

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# program_options.cpp
# Opt level: O3

void __thiscall
Potassco::ProgramOptions::ParsedValues::add(ParsedValues *this,string *name,string *value)

{
  option_iterator opt;
  
  opt = OptionContext::tryFind(this->ctx,(name->_M_dataplus)._M_p,find_name);
  if (opt._M_current !=
      (this->ctx->options_).
      super__Vector_base<Potassco::ProgramOptions::detail::IntrusiveSharedPtr<Potassco::ProgramOptions::Option>,_std::allocator<Potassco::ProgramOptions::detail::IntrusiveSharedPtr<Potassco::ProgramOptions::Option>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    add(this,opt._M_current,value);
    return;
  }
  return;
}

Assistant:

void ParsedValues::add(const std::string& name, const std::string& value) {
	OptionContext::option_iterator it = ctx->tryFind(name.c_str());
	if (it != ctx->end()) {
		add(*it, value);
	}
}